

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict,xmlChar *prefix,xmlChar *name,int maybeLen,int update)

{
  _xmlDict *p_Var1;
  undefined4 uVar2;
  uint hashValue;
  uint uVar3;
  int iVar4;
  uint uVar5;
  xmlDictEntry *pxVar6;
  xmlDictEntry *pxVar7;
  ulong uVar8;
  xmlDictStringsPtr_conflict pxVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  xmlDictEntry *pxVar13;
  xmlDict *__n;
  int iVar14;
  uint uVar15;
  xmlDictEntry *pxVar16;
  xmlChar *pxVar17;
  ulong uVar18;
  xmlChar *pxVar19;
  int found;
  _xmlDict *local_50;
  size_t len;
  size_t plen;
  xmlDictStringsPtr_conflict *local_38;
  
  found = 0;
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    if (prefix == (xmlChar *)0x0) {
      iVar4 = -1;
      if (-1 < maybeLen) {
        iVar4 = maybeLen;
      }
      hashValue = xmlDictHashName(dict->seed,name,(long)iVar4,&len);
      uVar11 = CONCAT44(len._4_4_,(uint)len);
      uVar8 = uVar11;
      if (0x3fffffff < uVar11) {
        return (xmlDictEntry *)0x0;
      }
    }
    else {
      hashValue = xmlDictHashQName(dict->seed,prefix,name,&plen,&len);
      uVar8 = CONCAT44(len._4_4_,(uint)len);
      if (0x3fffffff < uVar8) {
        return (xmlDictEntry *)0x0;
      }
      if (0x3fffffff - uVar8 <= plen) {
        return (xmlDictEntry *)0x0;
      }
      uVar11 = plen + uVar8 + 1;
    }
    if (uVar11 <= dict->limit - 1) {
      if (dict->size == 0) {
        pxVar6 = (xmlDictEntry *)0x0;
      }
      else {
        pxVar6 = xmlDictFindEntry(dict,prefix,name,(int)uVar11,hashValue,&found);
        if (found != 0) {
          return pxVar6;
        }
      }
      p_Var1 = dict->subdict;
      if ((p_Var1 != (_xmlDict *)0x0) && (p_Var1->size != 0)) {
        local_50 = p_Var1;
        if (prefix == (xmlChar *)0x0) {
          uVar3 = xmlDictHashName(p_Var1->seed,name,uVar8,&len);
        }
        else {
          uVar3 = xmlDictHashQName(p_Var1->seed,prefix,name,&plen,&len);
        }
        pxVar7 = xmlDictFindEntry(local_50,prefix,name,(int)uVar11,uVar3,&found);
        if (found != 0) {
          return pxVar7;
        }
      }
      if (update != 0) {
        uVar8 = dict->size;
        if ((uVar8 >> 3) * 7 < (ulong)(dict->nbElems + 1)) {
          if (uVar8 == 0) {
            uVar3 = 8;
          }
          else {
            if (0x7fffffff < uVar8) {
              return (xmlDictEntry *)0x0;
            }
            uVar3 = (int)uVar8 * 2;
          }
          uVar8 = (ulong)uVar3;
          pxVar7 = (xmlDictEntry *)(*xmlMalloc)(uVar8 * 0x10);
          if (pxVar7 == (xmlDictEntry *)0x0) {
            return (xmlDictEntry *)0x0;
          }
          memset(pxVar7,0,uVar8 * 0x10);
          uVar11 = dict->size;
          iVar4 = (int)uVar11;
          if (iVar4 != 0) {
            pxVar6 = dict->table;
            pxVar13 = pxVar6;
            while (pxVar13->hashValue != 0) {
              pxVar13 = pxVar13 + 1;
              if (pxVar6 + (uVar11 & 0xffffffff) <= pxVar13) {
                pxVar13 = pxVar6;
              }
            }
            for (iVar14 = 0; iVar14 != iVar4; iVar14 = iVar14 + 1) {
              if (pxVar13->hashValue != 0) {
                pxVar16 = pxVar7 + (pxVar13->hashValue & uVar3 - 1);
                while (pxVar16->hashValue != 0) {
                  pxVar16 = pxVar16 + 1;
                  if (pxVar7 + uVar8 <= pxVar16) {
                    pxVar16 = pxVar7;
                  }
                }
                uVar2 = *(undefined4 *)&pxVar13->field_0x4;
                pxVar19 = pxVar13->name;
                pxVar16->hashValue = pxVar13->hashValue;
                *(undefined4 *)&pxVar16->field_0x4 = uVar2;
                pxVar16->name = pxVar19;
              }
              pxVar13 = pxVar13 + 1;
              if (pxVar6 + (uVar11 & 0xffffffff) <= pxVar13) {
                pxVar13 = dict->table;
              }
            }
            (*xmlFree)(dict->table);
          }
          uVar3 = uVar3 - 1;
          dict->table = pxVar7;
          dict->size = uVar8;
          uVar5 = uVar3 & hashValue;
          uVar12 = 0;
          pxVar6 = pxVar7 + uVar5;
          while ((pxVar6->hashValue != 0 &&
                 (uVar12 <= ((uVar5 + uVar12) - pxVar6->hashValue & uVar3)))) {
            uVar15 = uVar5 + 1 + uVar12;
            uVar12 = uVar12 + 1;
            pxVar6 = pxVar6 + 1;
            if ((uVar15 & uVar3) == 0) {
              pxVar6 = pxVar7;
            }
          }
        }
        if (prefix == (xmlChar *)0x0) {
          uVar18 = (ulong)(uint)len;
          uVar8 = 0;
          uVar11 = 0;
          pxVar9 = (xmlDictStringsPtr_conflict)&dict->strings;
          while (pxVar9 = pxVar9->next, pxVar9 != (xmlDictStringsPtr_conflict)0x0) {
            pxVar17 = pxVar9->free;
            pxVar19 = pxVar17;
            if (uVar18 < (ulong)((long)pxVar9->end - (long)pxVar17)) goto LAB_0012be87;
            uVar10 = pxVar9->size;
            if (uVar8 < uVar10) {
              uVar8 = uVar10;
            }
            uVar11 = uVar11 + uVar10;
          }
          if ((dict->limit != 0) && (dict->limit < uVar11)) {
            return (xmlDictEntry *)0x0;
          }
          uVar11 = 0xffffffffffffffcf;
          if (uVar8 < 0x3ffffffffffffff3) {
            uVar11 = uVar8 * 4;
          }
          uVar10 = 1000;
          if (uVar8 != 0) {
            uVar10 = uVar11;
          }
          uVar8 = uVar18 * 4;
          if (uVar18 <= uVar10 >> 2) {
            uVar8 = uVar10;
          }
          local_50 = (_xmlDict *)&dict->strings;
          pxVar9 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar8 + 0x30);
          if (pxVar9 == (xmlDictStringsPtr_conflict)0x0) {
            return (xmlDictEntry *)0x0;
          }
          pxVar9->size = uVar8;
          pxVar9->nbStrings = 0;
          pxVar17 = pxVar9->array;
          pxVar9->free = pxVar17;
          pxVar9->end = pxVar9->array + uVar8;
          pxVar9->next = *(xmlDictStringsPtr *)local_50;
          *(xmlDictStringsPtr_conflict *)local_50 = pxVar9;
          pxVar19 = pxVar17;
        }
        else {
          uVar8 = 0;
          uVar11 = 0;
          pxVar9 = (xmlDictStringsPtr_conflict)&dict->strings;
          while (pxVar9 = pxVar9->next, pxVar9 != (xmlDictStringsPtr_conflict)0x0) {
            pxVar19 = pxVar9->free;
            __n = (xmlDict *)(plen & 0xffffffff);
            if ((ulong)((uint)len + (int)plen + 1) < (ulong)((long)pxVar9->end - (long)pxVar19))
            goto LAB_0012bda9;
            uVar18 = pxVar9->size;
            if (uVar8 < uVar18) {
              uVar8 = uVar18;
            }
            uVar11 = uVar11 + uVar18;
          }
          if ((dict->limit != 0) && (dict->limit < uVar11)) {
            return (xmlDictEntry *)0x0;
          }
          uVar11 = 1000;
          if (uVar8 != 0) {
            uVar11 = uVar8 * 4;
          }
          uVar8 = (ulong)(((uint)len + (int)plen) * 4 + 4);
          if (uVar11 <= uVar8) {
            uVar11 = uVar8;
          }
          local_50 = (xmlDict *)(plen & 0xffffffff);
          local_38 = &dict->strings;
          pxVar9 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar11 + 0x30);
          if (pxVar9 == (xmlDictStringsPtr_conflict)0x0) {
            return (xmlDictEntry *)0x0;
          }
          pxVar9->size = uVar11;
          pxVar9->nbStrings = 0;
          pxVar19 = pxVar9->array;
          pxVar9->free = pxVar19;
          pxVar9->end = pxVar9->array + uVar11;
          pxVar9->next = *local_38;
          *local_38 = pxVar9;
          __n = local_50;
LAB_0012bda9:
          memcpy(pxVar19,prefix,(size_t)__n);
          pxVar17 = (xmlChar *)((long)&__n->ref_counter + (long)pxVar9->free);
          pxVar9->free = pxVar17 + 1;
          *pxVar17 = ':';
          pxVar17 = pxVar9->free;
        }
LAB_0012be87:
        memcpy(pxVar17,name,(ulong)(uint)len);
        pxVar17 = pxVar9->free;
        pxVar9->free = pxVar17 + (uint)len + 1;
        pxVar17[(uint)len] = '\0';
        pxVar9->nbStrings = pxVar9->nbStrings + 1;
        if (pxVar19 != (xmlChar *)0x0) {
          if (pxVar6->hashValue != 0) {
            pxVar7 = dict->table;
            pxVar16 = pxVar7 + dict->size;
            pxVar13 = pxVar6;
            do {
              pxVar13 = pxVar13 + 1;
              if (pxVar16 <= pxVar13) {
                pxVar13 = pxVar7;
              }
            } while (pxVar13->hashValue != 0);
            if (pxVar13 < pxVar6) {
              memmove(pxVar7 + 1,pxVar7,(long)pxVar13 - (long)pxVar7);
              pxVar7 = dict->table;
              uVar2 = *(undefined4 *)&pxVar16[-1].field_0x4;
              pxVar17 = pxVar16[-1].name;
              pxVar13 = pxVar16 + -1;
              pxVar7->hashValue = pxVar16[-1].hashValue;
              *(undefined4 *)&pxVar7->field_0x4 = uVar2;
              pxVar7->name = pxVar17;
            }
            memmove(pxVar6 + 1,pxVar6,(long)pxVar13 - (long)pxVar6);
          }
          pxVar6->hashValue = hashValue;
          pxVar6->name = pxVar19;
          dict->nbElems = dict->nbElems + 1;
          return pxVar6;
        }
      }
    }
  }
  return (xmlDictEntry *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static const xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict, const xmlChar *prefix,
                      const xmlChar *name, int maybeLen, int update) {
    xmlDictEntry *entry = NULL;
    const xmlChar *ret;
    unsigned hashValue;
    size_t maxLen, len, plen, klen;
    int found = 0;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    maxLen = (maybeLen < 0) ? SIZE_MAX : (size_t) maybeLen;

    if (prefix == NULL) {
        hashValue = xmlDictHashName(dict->seed, name, maxLen, &len);
        if (len > INT_MAX / 2)
            return(NULL);
        klen = len;
    } else {
        hashValue = xmlDictHashQName(dict->seed, prefix, name, &plen, &len);
        if ((len > INT_MAX / 2) || (plen >= INT_MAX / 2 - len))
            return(NULL);
        klen = plen + 1 + len;
    }

    if ((dict->limit > 0) && (klen >= dict->limit))
        return(NULL);

    /*
     * Check for an existing entry
     */
    if (dict->size > 0)
        entry = xmlDictFindEntry(dict, prefix, name, klen, hashValue, &found);
    if (found)
        return(entry);

    if ((dict->subdict != NULL) && (dict->subdict->size > 0)) {
        xmlDictEntry *subEntry;
        unsigned subHashValue;

        if (prefix == NULL)
            subHashValue = xmlDictHashName(dict->subdict->seed, name, len,
                                           &len);
        else
            subHashValue = xmlDictHashQName(dict->subdict->seed, prefix, name,
                                            &plen, &len);
        subEntry = xmlDictFindEntry(dict->subdict, prefix, name, klen,
                                    subHashValue, &found);
        if (found)
            return(subEntry);
    }

    if (!update)
        return(NULL);

    /*
     * Grow the hash table if needed
     */
    if (dict->nbElems + 1 > dict->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
        unsigned newSize, mask, displ, pos;

        if (dict->size == 0) {
            newSize = MIN_HASH_SIZE;
        } else {
            if (dict->size >= MAX_HASH_SIZE)
                return(NULL);
            newSize = dict->size * 2;
        }
        if (xmlDictGrow(dict, newSize) != 0)
            return(NULL);

        /*
         * Find new entry
         */
        mask = dict->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &dict->table[pos];

        while ((entry->hashValue != 0) &&
               ((pos - entry->hashValue) & mask) >= displ) {
            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        }
    }

    if (prefix == NULL)
        ret = xmlDictAddString(dict, name, len);
    else
        ret = xmlDictAddQString(dict, prefix, plen, name, len);
    if (ret == NULL)
        return(NULL);

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlDictEntry *end = &dict->table[dict->size];
        const xmlDictEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = dict->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&dict->table[1], dict->table,
                    (char *) cur - (char *) dict->table);
            cur = end - 1;
            dict->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->hashValue = hashValue;
    entry->name = ret;

    dict->nbElems++;

    return(entry);
}